

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

int Catch(Situation *situation,Movement *move)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint position_row;
  int player;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *in_RSI;
  int *in_RDI;
  int catch_id_no_4;
  int catch_row_1;
  int i_3;
  int catch_id_no_3;
  int catch_col_1;
  int i_2;
  int catch_id_no_2;
  int catch_row;
  int i_1;
  int catch_id_no_1;
  int catch_col;
  int i;
  int catch_id_no;
  int from_row;
  int from_col;
  int horse_leg;
  int counter;
  int catch_id;
  int from_id;
  int to;
  int from;
  int opplayer_flag;
  int player_flag;
  int local_6c;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int local_48;
  int local_34;
  int local_28;
  
  iVar3 = GetPlayerFlag(*in_RDI);
  iVar4 = OpponentPlayer(*in_RDI);
  uVar5 = GetPlayerFlag(iVar4);
  uVar7 = (uint)in_RSI[1];
  bVar1 = *(byte *)((long)in_RDI + (long)(int)uVar7 + 4);
  uVar6 = GetCol(uVar7);
  position_row = GetRow(uVar7);
  iVar3 = (uint)bVar1 - iVar3;
  if (iVar3 - 5U < 2) {
    local_34 = 0;
    local_28 = HORSE_CAN_GET[(int)uVar7][0];
    while (local_28 != 0) {
      uVar6 = (uint)*(byte *)((long)in_RDI + (long)local_28 + 4);
      if ((*(char *)((long)in_RDI + (long)HORSE_LEG[(int)uVar7][local_34] + 4) == '\0') &&
         ((uVar6 & uVar5) != 0)) {
        iVar4 = uVar6 - uVar5;
        if (uVar6 == uVar5) {
          return uVar6;
        }
        if (iVar4 < 9) {
          if (6 < iVar4) {
            return uVar6;
          }
        }
        else {
          if (iVar4 < 0xb) {
            OpponentPlayer(*in_RDI);
            bVar2 = IfProtected(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                (Situation *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff9c);
          }
          else {
            iVar4 = OpponentPlayer(*in_RDI);
            bVar2 = InHomeHalf(local_28,iVar4);
            if (bVar2) goto LAB_001107a1;
            OpponentPlayer(*in_RDI);
            bVar2 = IfProtected(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                (Situation *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff9c);
          }
          if (!bVar2) {
            return uVar6;
          }
        }
      }
LAB_001107a1:
      local_34 = local_34 + 1;
      local_28 = HORSE_CAN_GET[(int)uVar7][local_34];
    }
  }
  else if (iVar3 - 7U < 2) {
    uVar7 = GetCol((uint)*in_RSI);
    if (uVar6 == uVar7) {
      for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
        uVar7 = (uint)*(byte *)((long)(int)(uVar6 - 3) * 0x1000 +
                                (ulong)*(ushort *)
                                        ((long)in_RDI + (long)(int)position_row * 2 + 0x134) * 8 +
                                0x313d82 + (long)local_48);
        if (uVar7 != uVar6) {
          iVar4 = GetPosition(uVar7,position_row);
          uVar7 = (uint)*(byte *)((long)in_RDI + (long)iVar4 + 4);
          if ((uVar7 & uVar5) != 0) {
            iVar3 = uVar7 - uVar5;
            if (iVar3 == 0) {
              return uVar7;
            }
            if (iVar3 < 8) {
              if ((iVar3 < 5) || (6 < iVar3)) goto LAB_001109b4;
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(iVar3,in_stack_ffffffffffffffac,
                                  (Situation *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            }
            else if (iVar3 < 0xb) {
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(iVar3,in_stack_ffffffffffffffac,
                                  (Situation *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            }
            else {
              iVar9 = OpponentPlayer(*in_RDI);
              bVar2 = InHomeHalf(iVar4,iVar9);
              if (bVar2) goto LAB_001109b4;
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(iVar3,in_stack_ffffffffffffffac,
                                  (Situation *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            }
            if (!bVar2) {
              return uVar7;
            }
          }
        }
LAB_001109b4:
      }
    }
    else {
      for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
        uVar7 = (uint)*(byte *)((long)(int)(position_row - 3) * 0x2000 +
                                (ulong)*(ushort *)((long)in_RDI + (long)(int)uVar6 * 2 + 0x154) * 8
                                + 0x31cd82 + (long)iVar4);
        if (uVar7 != position_row) {
          iVar3 = GetPosition(uVar6,uVar7);
          uVar7 = (uint)*(byte *)((long)in_RDI + (long)iVar3 + 4);
          if ((uVar7 & uVar5) != 0) {
            iVar9 = uVar7 - uVar5;
            if (iVar9 == 0) {
              return uVar7;
            }
            if (iVar9 < 8) {
              if ((iVar9 < 5) || (6 < iVar9)) goto LAB_00110b84;
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(in_stack_ffffffffffffffb0,iVar4,
                                  (Situation *)CONCAT44(iVar9,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            }
            else if (iVar9 < 0xb) {
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(in_stack_ffffffffffffffb0,iVar4,
                                  (Situation *)CONCAT44(iVar9,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            }
            else {
              player = OpponentPlayer(*in_RDI);
              bVar2 = InHomeHalf(iVar3,player);
              if (bVar2) goto LAB_00110b84;
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(in_stack_ffffffffffffffb0,iVar4,
                                  (Situation *)CONCAT44(iVar9,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
            }
            if (!bVar2) {
              return uVar7;
            }
          }
        }
LAB_00110b84:
      }
    }
  }
  else if (iVar3 - 9U < 2) {
    uVar7 = GetCol((uint)*in_RSI);
    if (uVar6 == uVar7) {
      for (iVar4 = 0; iVar4 < 2; iVar4 = iVar4 + 1) {
        uVar7 = (uint)*(byte *)((long)(int)(uVar6 - 3) * 0x1000 +
                                (ulong)*(ushort *)
                                        ((long)in_RDI + (long)(int)position_row * 2 + 0x134) * 8 +
                                0x313d84 + (long)iVar4);
        if (uVar7 != uVar6) {
          iVar3 = GetPosition(uVar7,position_row);
          uVar8 = (uint)*(byte *)((long)in_RDI + (long)iVar3 + 4);
          if ((uVar8 & uVar5) != 0) {
            iVar9 = uVar8 - uVar5;
            if (uVar8 == uVar5) {
              return uVar8;
            }
            if (iVar9 < 9) {
              if (iVar9 < 5) {
                return uVar8;
              }
              if (6 < iVar9) {
                return uVar8;
              }
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                  (Situation *)CONCAT44(in_stack_ffffffffffffffa4,iVar4),uVar7);
joined_r0x00110d35:
              if (!bVar2) {
                return uVar8;
              }
            }
            else if (10 < iVar9) {
              iVar9 = OpponentPlayer(*in_RDI);
              bVar2 = InHomeHalf(iVar3,iVar9);
              if (!bVar2) {
                OpponentPlayer(*in_RDI);
                bVar2 = IfProtected(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                    (Situation *)CONCAT44(in_stack_ffffffffffffffa4,iVar4),uVar7);
                goto joined_r0x00110d35;
              }
            }
          }
        }
      }
    }
    else {
      for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
        uVar7 = (uint)*(byte *)((long)(int)(position_row - 3) * 0x2000 +
                                (ulong)*(ushort *)((long)in_RDI + (long)(int)uVar6 * 2 + 0x154) * 8
                                + 0x31cd84 + (long)local_6c);
        if (uVar7 != position_row) {
          iVar4 = GetPosition(uVar6,uVar7);
          uVar7 = (uint)*(byte *)((long)in_RDI + (long)iVar4 + 4);
          if ((uVar7 & uVar5) != 0) {
            iVar3 = uVar7 - uVar5;
            if (uVar7 == uVar5) {
              return uVar7;
            }
            if (iVar3 < 9) {
              if (iVar3 < 5) {
                return uVar7;
              }
              if (6 < iVar3) {
                return uVar7;
              }
              OpponentPlayer(*in_RDI);
              bVar2 = IfProtected(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                  (Situation *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff9c);
joined_r0x00110ed8:
              if (!bVar2) {
                return uVar7;
              }
            }
            else if (10 < iVar3) {
              iVar3 = OpponentPlayer(*in_RDI);
              bVar2 = InHomeHalf(iVar4,iVar3);
              if (!bVar2) {
                OpponentPlayer(*in_RDI);
                bVar2 = IfProtected(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                                    (Situation *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                    in_stack_ffffffffffffff9c);
                goto joined_r0x00110ed8;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Catch(const Situation & situation, const Movement & move){
    int player_flag, opplayer_flag, from, to, from_id, catch_id, counter;
    player_flag = GetPlayerFlag(situation.current_player);
    opplayer_flag = GetPlayerFlag(OpponentPlayer(situation.current_player));
    from = move.to;
    from_id = situation.current_board[from];
    int horse_leg;
    int from_col = GetCol(from), from_row = GetRow(from);

    switch (from_id - player_flag){
    // 马抓子
    case 5:
    case 6:
        counter = 0;
        to = HORSE_CAN_GET[from][counter];
        while(to != 0){
            horse_leg = HORSE_LEG[from][counter];
            catch_id = situation.current_board[to];
            if(situation.current_board[horse_leg] == 0 && (catch_id & opplayer_flag) != 0){
                int catch_id_no = catch_id - opplayer_flag;
                if(catch_id_no == 0) return catch_id;
                if(catch_id_no <= 8){
                    if(catch_id_no >= 7) return catch_id;
                }
                else if(catch_id_no <= 10){
                    if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
                else{
                    if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
            }
            counter ++;
            to = HORSE_CAN_GET[from][counter];
        }
        break;
    // 车抓子
    case 7:
    case 8:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].rook_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].rook_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    // 炮抓子
    case 9:
    case 10:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].cannon_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].cannon_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    default:
        break;
    }
    return 0;
}